

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O0

int read_image_tga(gdIOCtx *ctx,oTga *tga)

{
  uint b;
  int a;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  void *buf;
  int rle_size;
  int encoded_pixels;
  int i;
  int bitmap_caret;
  int buffer_caret;
  uchar *conversion_buffer;
  int *decompression_buffer;
  int image_block_size;
  int pixel_block_size;
  oTga *tga_local;
  gdIOCtx *ctx_local;
  
  b = tga->bits / 8;
  a = tga->width * tga->height * b;
  i = 0;
  encoded_pixels = 0;
  iVar1 = overflow2(tga->width,tga->height);
  if (iVar1 == 0) {
    iVar1 = overflow2(tga->width * tga->height,b);
    if (iVar1 == 0) {
      iVar1 = overflow2(a,4);
      if (iVar1 == 0) {
        if ((tga->imagetype == '\x02') || (tga->imagetype == '\n')) {
          piVar4 = (int *)gdMalloc((long)a << 2);
          tga->bitmap = piVar4;
          if (tga->bitmap == (int *)0x0) {
            ctx_local._4_4_ = -1;
          }
          else {
            if (tga->imagetype == '\x02') {
              pvVar5 = gdMalloc((long)a);
              if (pvVar5 == (void *)0x0) {
                return -1;
              }
              iVar1 = gdGetBuf(pvVar5,a,ctx);
              if (iVar1 != a) {
                gd_error("gd-tga: premature end of image data\n");
                gdFree(pvVar5);
                return -1;
              }
              for (; i < a; i = i + 1) {
                tga->bitmap[i] = (uint)*(byte *)((long)pvVar5 + (long)i);
              }
              gdFree(pvVar5);
            }
            else if (tga->imagetype == '\n') {
              pvVar5 = gdMalloc((long)a << 2);
              if (pvVar5 == (void *)0x0) {
                return -1;
              }
              buf = gdMalloc((long)a);
              if (buf == (void *)0x0) {
                gd_error("gd-tga: premature end of image data\n");
                gdFree(pvVar5);
                return -1;
              }
              iVar1 = gdGetBuf(buf,a,ctx);
              if (iVar1 < 1) {
                gdFree(buf);
                gdFree(pvVar5);
                return -1;
              }
              for (i = 0; i < iVar1; i = i + 1) {
                *(uint *)((long)pvVar5 + (long)i * 4) = (uint)*(byte *)((long)buf + (long)i);
              }
              i = 0;
              while (encoded_pixels < a) {
                if (iVar1 < (int)(i + b)) {
                  gdFree(pvVar5);
                  gdFree(buf);
                  return -1;
                }
                if ((*(uint *)((long)pvVar5 + (long)i * 4) & 0x80) == 0x80) {
                  iVar2 = (*(uint *)((long)pvVar5 + (long)i * 4) & 0xffffff7f) + 1;
                  iVar3 = i + 1;
                  if ((a < (int)(encoded_pixels + iVar2 * b)) || (iVar1 < (int)(iVar3 + b))) {
                    gdFree(pvVar5);
                    gdFree(buf);
                    return -1;
                  }
                  for (rle_size = 0; rle_size < iVar2; rle_size = rle_size + 1) {
                    memcpy(tga->bitmap + encoded_pixels,(void *)((long)pvVar5 + (long)iVar3 * 4),
                           (long)(int)b << 2);
                    encoded_pixels = b + encoded_pixels;
                  }
                  i = b + iVar3;
                }
                else {
                  iVar2 = *(int *)((long)pvVar5 + (long)i * 4) + 1;
                  iVar3 = i + 1;
                  if ((a < (int)(encoded_pixels + iVar2 * b)) || (iVar1 < (int)(iVar3 + iVar2 * b)))
                  {
                    gdFree(pvVar5);
                    gdFree(buf);
                    return -1;
                  }
                  memcpy(tga->bitmap + encoded_pixels,(void *)((long)pvVar5 + (long)iVar3 * 4),
                         (long)(int)(iVar2 * b) << 2);
                  encoded_pixels = iVar2 * b + encoded_pixels;
                  i = iVar2 * b + iVar3;
                }
              }
              gdFree(pvVar5);
              gdFree(buf);
            }
            ctx_local._4_4_ = 1;
          }
        }
        else {
          ctx_local._4_4_ = -1;
        }
      }
      else {
        ctx_local._4_4_ = -1;
      }
    }
    else {
      ctx_local._4_4_ = -1;
    }
  }
  else {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

int read_image_tga( gdIOCtx *ctx, oTga *tga )
{
	int pixel_block_size = (tga->bits / 8);
	int image_block_size = (tga->width * tga->height) * pixel_block_size;
	int* decompression_buffer = NULL;
	unsigned char* conversion_buffer = NULL;
	int buffer_caret = 0;
	int bitmap_caret = 0;
	int i = 0;
	int encoded_pixels;
	int rle_size;

	if(overflow2(tga->width, tga->height)) {
		return -1;
	}

	if(overflow2(tga->width * tga->height, pixel_block_size)) {
		return -1;
	}

	if(overflow2(image_block_size, sizeof(int))) {
		return -1;
	}

	/*! \todo Add more image type support.
	 */
	if (tga->imagetype != TGA_TYPE_RGB && tga->imagetype != TGA_TYPE_RGB_RLE)
		return -1;

	/*!	\brief Allocate memmory for image block
	 *  Allocate a chunk of memory for the image block to be passed into.
	 */
	tga->bitmap = (int *) gdMalloc(image_block_size * sizeof(int));
	if (tga->bitmap == NULL)
		return -1;

	switch (tga->imagetype) {
	case TGA_TYPE_RGB:
		/*! \brief Read in uncompressed RGB TGA
		 *  Chunk load the pixel data from an uncompressed RGB type TGA.
		 */
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			return -1;
		}

		if (gdGetBuf(conversion_buffer, image_block_size, ctx) != image_block_size) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree(conversion_buffer);
			return -1;
		}

		while (buffer_caret < image_block_size) {
			tga->bitmap[buffer_caret] = (int) conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		gdFree(conversion_buffer);
		break;

	case TGA_TYPE_RGB_RLE:
		/*! \brief Read in RLE compressed RGB TGA
		 *  Chunk load the pixel data from an RLE compressed RGB type TGA.
		 */
		decompression_buffer = (int*) gdMalloc(image_block_size * sizeof(int));
		if (decompression_buffer == NULL) {
			return -1;
		}
		conversion_buffer = (unsigned char *) gdMalloc(image_block_size * sizeof(unsigned char));
		if (conversion_buffer == NULL) {
			gd_error("gd-tga: premature end of image data\n");
			gdFree( decompression_buffer );
			return -1;
		}

		rle_size = gdGetBuf(conversion_buffer, image_block_size, ctx);
		if (rle_size <= 0) {
			gdFree(conversion_buffer);
			gdFree(decompression_buffer);
			return -1;
		}

		buffer_caret = 0;

		while( buffer_caret < rle_size) {
			decompression_buffer[buffer_caret] = (int)conversion_buffer[buffer_caret];
			buffer_caret++;
		}

		buffer_caret = 0;

		while( bitmap_caret < image_block_size ) {

			if (buffer_caret + pixel_block_size > rle_size) {
				gdFree( decompression_buffer );
				gdFree( conversion_buffer );
				return -1;
			}

			if ((decompression_buffer[buffer_caret] & TGA_RLE_FLAG) == TGA_RLE_FLAG) {
				encoded_pixels = ( ( decompression_buffer[ buffer_caret ] & ~TGA_RLE_FLAG ) + 1 );
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + pixel_block_size > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				for (i = 0; i < encoded_pixels; i++) {
					memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, pixel_block_size * sizeof(int));
					bitmap_caret += pixel_block_size;
				}
				buffer_caret += pixel_block_size;

			} else {
				encoded_pixels = decompression_buffer[ buffer_caret ] + 1;
				buffer_caret++;

				if ((bitmap_caret + (encoded_pixels * pixel_block_size)) > image_block_size
						|| buffer_caret + (encoded_pixels * pixel_block_size) > rle_size) {
					gdFree( decompression_buffer );
					gdFree( conversion_buffer );
					return -1;
				}

				memcpy(tga->bitmap + bitmap_caret, decompression_buffer + buffer_caret, encoded_pixels * pixel_block_size * sizeof(int));
				bitmap_caret += (encoded_pixels * pixel_block_size);
				buffer_caret += (encoded_pixels * pixel_block_size);
			}
		}
		gdFree( decompression_buffer );
		gdFree( conversion_buffer );
		break;
	}

	return 1;
}